

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  char *pcVar1;
  int addr;
  double *zP4;
  long lVar2;
  double value;
  double local_20;
  
  if (z != (char *)0x0) {
    lVar2 = 0;
    do {
      pcVar1 = z + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pcVar1 != '\0');
    sqlite3AtoF(z,&local_20,(int)lVar2 - 1U & 0x3fffffff,'\x01');
    if (negateFlag != 0) {
      local_20 = -local_20;
    }
    zP4 = (double *)sqlite3DbMallocRaw(v->db,8);
    if (zP4 != (double *)0x0) {
      *zP4 = local_20;
    }
    addr = sqlite3VdbeAddOp3(v,0x82,0,iMem,0);
    sqlite3VdbeChangeP4(v,addr,(char *)zP4,-0xc);
  }
  return;
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    char *zV;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    zV = dup8bytes(v, (char*)&value);
    sqlite3VdbeAddOp4(v, OP_Real, 0, iMem, 0, zV, P4_REAL);
  }
}